

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O3

string * __thiscall
slang::TextDiagnosticClient::getString_abi_cxx11_
          (string *__return_storage_ptr__,TextDiagnosticClient *this)

{
  FormatBuffer *pFVar1;
  long lVar2;
  size_t sVar3;
  
  pFVar1 = (this->buffer)._M_t.
           super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
           _M_t.
           super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
           super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
  lVar2 = *(long *)&(pFVar1->buf).super_buffer<char>;
  sVar3 = *(size_t *)((long)&(pFVar1->buf).super_buffer<char> + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar2,sVar3 + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string TextDiagnosticClient::getString() const {
    return buffer->str();
}